

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_sdl2.cpp
# Opt level: O0

void ImGui_ImplSDL2_Shutdown(void)

{
  ImGui_ImplSDL2_Data *pIVar1;
  ImGuiIO *pIVar2;
  ImGuiMouseCursor cursor_n;
  ImGuiIO *io;
  ImGui_ImplSDL2_Data *bd;
  int local_14;
  
  pIVar1 = ImGui_ImplSDL2_GetBackendData();
  pIVar2 = ImGui::GetIO();
  if (pIVar1->ClipboardTextData != (char *)0x0) {
    SDL_free(pIVar1->ClipboardTextData);
  }
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    SDL_FreeCursor(pIVar1->MouseCursors[local_14]);
  }
  ImGui_ImplSDL2_CloseGamepads();
  pIVar2->BackendPlatformName = (char *)0x0;
  pIVar2->BackendPlatformUserData = (void *)0x0;
  pIVar2->BackendFlags = pIVar2->BackendFlags & 0xfffffff8;
  IM_DELETE<ImGui_ImplSDL2_Data>((ImGui_ImplSDL2_Data *)0x2908af);
  return;
}

Assistant:

void ImGui_ImplSDL2_Shutdown()
{
    ImGui_ImplSDL2_Data* bd = ImGui_ImplSDL2_GetBackendData();
    IM_ASSERT(bd != nullptr && "No platform backend to shutdown, or already shutdown?");
    ImGuiIO& io = ImGui::GetIO();

    if (bd->ClipboardTextData)
        SDL_free(bd->ClipboardTextData);
    for (ImGuiMouseCursor cursor_n = 0; cursor_n < ImGuiMouseCursor_COUNT; cursor_n++)
        SDL_FreeCursor(bd->MouseCursors[cursor_n]);
    ImGui_ImplSDL2_CloseGamepads();

    io.BackendPlatformName = nullptr;
    io.BackendPlatformUserData = nullptr;
    io.BackendFlags &= ~(ImGuiBackendFlags_HasMouseCursors | ImGuiBackendFlags_HasSetMousePos | ImGuiBackendFlags_HasGamepad);
    IM_DELETE(bd);
}